

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

ByteArray *
ot::commissioner::CommissionerImpl::GetCommissionerDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  pointer *ppuVar1;
  iterator iVar2;
  uchar local_20 [8];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((aDatasetFlags >> 0xe & 1) != 0) {
    local_20[7] = 0xb;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 7);
    }
    else {
      *iVar2._M_current = '\v';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((short)aDatasetFlags < 0) {
    local_20[6] = 9;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 6);
    }
    else {
      *iVar2._M_current = '\t';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 0xd & 1) != 0) {
    local_20[5] = 8;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 5);
    }
    else {
      *iVar2._M_current = '\b';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 0xc & 1) != 0) {
    local_20[4] = 0x3d;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 4);
    }
    else {
      *iVar2._M_current = '=';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 0xb & 1) != 0) {
    local_20[3] = 0x3e;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 3);
    }
    else {
      *iVar2._M_current = '>';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 10 & 1) != 0) {
    local_20[2] = 0x12;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 2);
    }
    else {
      *iVar2._M_current = '\x12';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 9 & 1) != 0) {
    local_20[1] = 0x41;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20 + 1);
    }
    else {
      *iVar2._M_current = 'A';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags >> 8 & 1) != 0) {
    local_20[0] = 'B';
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_20);
    }
    else {
      *iVar2._M_current = 'B';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetCommissionerDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & CommissionerDataset::kSessionIdBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kCommissionerSessionId));
    }

    if (aDatasetFlags & CommissionerDataset::kBorderAgentLocatorBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kBorderAgentLocator));
    }

    if (aDatasetFlags & CommissionerDataset::kSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kAeSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kAeSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kNmkpSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kNmkpSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kJoinerUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kJoinerUdpPort));
    }

    if (aDatasetFlags & CommissionerDataset::kAeUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kAeUdpPort));
    }

    if (aDatasetFlags & CommissionerDataset::kNmkpUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kNmkpUdpPort));
    }
    return tlvTypes;
}